

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Dumper::dump(Dumper *this,Slice slice)

{
  Sink *pSVar1;
  ulong uVar2;
  Slice local_18;
  
  this->_indentation = 0;
  pSVar1 = this->_sink;
  uVar2 = (ulong)"\x01\x01"[*slice._start];
  local_18._start = slice._start;
  if (uVar2 == 0) {
    uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_18,slice._start);
  }
  (*pSVar1->_vptr_Sink[4])(pSVar1,uVar2);
  dumpValue(this,local_18,(Slice *)0x0);
  return;
}

Assistant:

void Dumper::dump(Slice slice) {
  _indentation = 0;
  _sink->reserve(slice.byteSize());
  dumpValue(slice);
}